

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_crl.cc
# Opt level: O0

int crl_parse_entry_extensions(X509_CRL *crl)

{
  stack_st_X509_EXTENSION *sk;
  X509_REVOKED *pXVar1;
  int iVar2;
  X509_REVOKED *pXVar3;
  ASN1_ENUMERATED *a;
  long lVar4;
  X509_EXTENSION *pXVar5;
  X509_EXTENSION *ex;
  X509_EXTENSION *ext;
  size_t j;
  stack_st_X509_EXTENSION *exts;
  ASN1_ENUMERATED *reason;
  X509_REVOKED *pXStack_30;
  int crit;
  X509_REVOKED *rev;
  size_t i;
  stack_st_X509_REVOKED *revoked;
  X509_CRL *crl_local;
  
  revoked = (stack_st_X509_REVOKED *)crl;
  i = (size_t)X509_CRL_get_REVOKED(crl);
  rev = (X509_REVOKED *)0x0;
  do {
    pXVar1 = rev;
    pXVar3 = (X509_REVOKED *)sk_X509_REVOKED_num((stack_st_X509_REVOKED *)i);
    if (pXVar3 <= pXVar1) {
      return 1;
    }
    pXStack_30 = (X509_REVOKED *)sk_X509_REVOKED_value((stack_st_X509_REVOKED *)i,(size_t)rev);
    a = (ASN1_ENUMERATED *)
        X509_REVOKED_get_ext_d2i(pXStack_30,0x8d,(int *)((long)&reason + 4),(int *)0x0);
    if ((a == (ASN1_ENUMERATED *)0x0) && (reason._4_4_ != -1)) {
      *(uint *)(revoked + 0x1c) = *(uint *)(revoked + 0x1c) | 0x80;
      return 1;
    }
    if (a == (ASN1_ENUMERATED *)0x0) {
      *(undefined4 *)&pXStack_30->issuer = 0xffffffff;
    }
    else {
      lVar4 = ASN1_ENUMERATED_get(a);
      *(int *)&pXStack_30->issuer = (int)lVar4;
      ASN1_ENUMERATED_free(a);
    }
    sk = (stack_st_X509_EXTENSION *)pXStack_30->extensions;
    for (ext = (X509_EXTENSION *)0x0; pXVar5 = (X509_EXTENSION *)sk_X509_EXTENSION_num(sk),
        ext < pXVar5; ext = (X509_EXTENSION *)((long)&ext->object + 1)) {
      ex = (X509_EXTENSION *)sk_X509_EXTENSION_value(sk,(size_t)ext);
      iVar2 = X509_EXTENSION_get_critical(ex);
      if (iVar2 != 0) {
        *(uint *)(revoked + 0x1c) = *(uint *)(revoked + 0x1c) | 0x200;
        break;
      }
    }
    rev = (X509_REVOKED *)((long)&rev->serialNumber + 1);
  } while( true );
}

Assistant:

static int crl_parse_entry_extensions(X509_CRL *crl) {
  STACK_OF(X509_REVOKED) *revoked = X509_CRL_get_REVOKED(crl);
  for (size_t i = 0; i < sk_X509_REVOKED_num(revoked); i++) {
    X509_REVOKED *rev = sk_X509_REVOKED_value(revoked, i);

    int crit;
    ASN1_ENUMERATED *reason = reinterpret_cast<ASN1_ENUMERATED *>(
        X509_REVOKED_get_ext_d2i(rev, NID_crl_reason, &crit, NULL));
    if (!reason && crit != -1) {
      crl->flags |= EXFLAG_INVALID;
      return 1;
    }

    if (reason) {
      rev->reason = ASN1_ENUMERATED_get(reason);
      ASN1_ENUMERATED_free(reason);
    } else {
      rev->reason = CRL_REASON_NONE;
    }

    // We do not support any critical CRL entry extensions.
    const STACK_OF(X509_EXTENSION) *exts = rev->extensions;
    for (size_t j = 0; j < sk_X509_EXTENSION_num(exts); j++) {
      const X509_EXTENSION *ext = sk_X509_EXTENSION_value(exts, j);
      if (X509_EXTENSION_get_critical(ext)) {
        crl->flags |= EXFLAG_CRITICAL;
        break;
      }
    }
  }

  return 1;
}